

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::BufferBase<Diligent::EngineGLImplTraits>::DvpVerifyFlushMappedRangeArguments
          (BufferBase<Diligent::EngineGLImplTraits> *this,Uint64 StartOffset,Uint64 Size)

{
  MEMORY_PROPERTIES MVar1;
  Char *pCVar2;
  long lVar3;
  ulong uVar4;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint64 Size_local;
  Uint64 StartOffset_local;
  BufferBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = Size;
  MVar1 = GetMemoryProperties(this);
  MVar1 = Diligent::operator&(MVar1,MEMORY_PROPERTY_HOST_COHERENT);
  if (MVar1 != MEMORY_PROPERTY_UNKNOWN) {
    FormatString<char[45]>
              ((string *)local_40,(char (*) [45])"Coherent memory does not need to be flushed.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)local_40);
  }
  lVar3 = (**(code **)((long)(this->
                             super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                             ).super_ObjectBase<Diligent::IBufferGL>.
                             super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
                             super_IBuffer.super_IDeviceObject.super_IObject + 0x20))();
  if (*(char *)(lVar3 + 0x14) == '\x02') {
    FormatString<char[52]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [52])"Dynamic buffer mapped memory must never be flushed.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x102);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  uVar4 = StartOffset + msg.field_2._8_8_;
  lVar3 = (**(code **)((long)(this->
                             super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                             ).super_ObjectBase<Diligent::IBufferGL>.
                             super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
                             super_IBuffer.super_IDeviceObject.super_IObject + 0x20))();
  if (*(ulong *)(lVar3 + 8) < uVar4) {
    FormatString<char[38]>
              ((string *)local_90,(char (*) [38])"Memory range is out of buffer bounds.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x103);
    std::__cxx11::string::~string((string *)local_90);
  }
  return;
}

Assistant:

void DvpVerifyFlushMappedRangeArguments(Uint64 StartOffset,
                                            Uint64 Size) const
    {
#ifdef DILIGENT_DEVELOPMENT
        DEV_CHECK_ERR((GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0, "Coherent memory does not need to be flushed.");
        DEV_CHECK_ERR(this->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffer mapped memory must never be flushed.");
        DEV_CHECK_ERR(StartOffset + Size <= this->GetDesc().Size, "Memory range is out of buffer bounds.");
#endif
    }